

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

bool __thiscall amrex::StreamRetry::TryOutput(StreamRetry *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  Print *pPVar7;
  bool bVar8;
  double dVar9;
  Print PStack_1a8;
  
  iVar5 = this->tries;
  if (iVar5 == 0) {
    this->tries = 1;
LAB_003fa6aa:
    bVar8 = true;
  }
  else {
    if (((byte)this->sros[*(long *)(*(long *)this->sros + -0x18) + 0x20] & 5) != 0) {
      nStreamErrors = nStreamErrors + 1;
      iVar2 = *(int *)(ParallelContext::frames + 0xc);
      iVar3 = this->maxTries;
      iVar4 = Verbose();
      if (iVar5 <= iVar3) {
        if (1 < iVar4) {
          poVar6 = OutStream();
          AllPrint::AllPrint((AllPrint *)&PStack_1a8,poVar6);
          poVar1 = &PStack_1a8.ss;
          std::operator<<((ostream *)poVar1,"PROC: ");
          std::ostream::operator<<(poVar1,iVar2);
          std::operator<<((ostream *)poVar1," :: STREAMRETRY_");
          std::operator<<((ostream *)poVar1,(string *)&this->suffix);
          std::operator<<((ostream *)poVar1," # ");
          pPVar7 = Print::operator<<(&PStack_1a8,&this->tries);
          poVar1 = &pPVar7->ss;
          std::operator<<((ostream *)poVar1," :: gbfe:  ");
          bVar8 = SUB81(poVar1,0);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::operator<<((ostream *)poVar1," :: sec = ");
          dVar9 = ParallelDescriptor::second();
          std::ostream::_M_insert<double>(dVar9);
          std::operator<<((ostream *)poVar1," :: os.tellp() = ");
          std::ostream::tellp();
          std::ostream::_M_insert<long>((long)poVar1);
          std::operator<<((ostream *)poVar1," :: rewind spos = ");
          pPVar7 = Print::operator<<(pPVar7,&this->spos);
          std::endl<char,std::char_traits<char>>((ostream *)&pPVar7->ss);
          Print::~Print(&PStack_1a8);
        }
        std::ios::clear((int)this->sros + (int)*(undefined8 *)(*(long *)this->sros + -0x18));
        iVar5 = Verbose();
        if (1 < iVar5) {
          poVar6 = OutStream();
          AllPrint::AllPrint((AllPrint *)&PStack_1a8,poVar6);
          poVar1 = &PStack_1a8.ss;
          std::operator<<((ostream *)poVar1,"After os.clear() : gbfe:  ");
          bVar8 = SUB81(poVar1,0);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::ostream::_M_insert<bool>(bVar8);
          std::endl<char,std::char_traits<char>>((ostream *)poVar1);
          Print::~Print(&PStack_1a8);
        }
        std::ostream::seekp((long)this->sros,(_Ios_Seekdir)(this->spos)._M_off);
        this->tries = this->tries + 1;
        goto LAB_003fa6aa;
      }
      if (1 < iVar4) {
        poVar6 = OutStream();
        AllPrint::AllPrint((AllPrint *)&PStack_1a8,poVar6);
        poVar1 = &PStack_1a8.ss;
        std::operator<<((ostream *)poVar1,"PROC: ");
        std::ostream::operator<<(poVar1,iVar2);
        std::operator<<((ostream *)poVar1," :: STREAMFAILED_");
        std::operator<<((ostream *)poVar1,(string *)&this->suffix);
        std::operator<<((ostream *)poVar1," # ");
        pPVar7 = Print::operator<<(&PStack_1a8,&this->tries);
        poVar1 = &pPVar7->ss;
        std::operator<<((ostream *)poVar1," :: File may be corrupt.  :: gbfe:  ");
        bVar8 = SUB81(poVar1,0);
        std::ostream::_M_insert<bool>(bVar8);
        std::ostream::_M_insert<bool>(bVar8);
        std::ostream::_M_insert<bool>(bVar8);
        std::ostream::_M_insert<bool>(bVar8);
        std::operator<<((ostream *)poVar1," :: sec = ");
        dVar9 = ParallelDescriptor::second();
        std::ostream::_M_insert<double>(dVar9);
        std::operator<<((ostream *)poVar1," :: os.tellp() = ");
        std::ostream::tellp();
        std::ostream::_M_insert<long>((long)poVar1);
        std::operator<<((ostream *)poVar1," :: rewind spos = ");
        pPVar7 = Print::operator<<(pPVar7,&this->spos);
        std::endl<char,std::char_traits<char>>((ostream *)&pPVar7->ss);
        Print::~Print(&PStack_1a8);
      }
      std::ios::clear((int)this->sros + (int)*(undefined8 *)(*(long *)this->sros + -0x18));
      iVar5 = Verbose();
      if (iVar5 < 2) {
        return false;
      }
      poVar6 = OutStream();
      AllPrint::AllPrint((AllPrint *)&PStack_1a8,poVar6);
      poVar1 = &PStack_1a8.ss;
      std::operator<<((ostream *)poVar1,"After os.clear() : gbfe:  ");
      bVar8 = SUB81(poVar1,0);
      std::ostream::_M_insert<bool>(bVar8);
      std::ostream::_M_insert<bool>(bVar8);
      std::ostream::_M_insert<bool>(bVar8);
      std::ostream::_M_insert<bool>(bVar8);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      Print::~Print(&PStack_1a8);
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool amrex::StreamRetry::TryOutput()
{
  if(tries == 0) {
    ++tries;
    return true;
  } else {
    if(sros.fail()) {
      ++nStreamErrors;
      int myProc(ParallelDescriptor::MyProc());
      if(tries <= maxTries) {
          if (amrex::Verbose() > 1) {
              amrex::AllPrint() << "PROC: " << myProc << " :: STREAMRETRY_" << suffix << " # "
                                << tries << " :: gbfe:  "
                                << sros.good() << sros.bad() << sros.fail() << sros.eof()
                                << " :: sec = " << ParallelDescriptor::second()
                                << " :: os.tellp() = " << sros.tellp()
                                << " :: rewind spos = " << spos
                                << std::endl;
          }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        sros.seekp(spos, std::ios::beg);  // reset stream position
        ++tries;
        return true;
      } else {
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "PROC: " << myProc << " :: STREAMFAILED_" << suffix << " # "
                              << tries << " :: File may be corrupt.  :: gbfe:  "
                              << sros.good() << sros.bad() << sros.fail() << sros.eof()
                              << " :: sec = " << ParallelDescriptor::second()
                              << " :: os.tellp() = " << sros.tellp()
                              << " :: rewind spos = " << spos
                              << std::endl;
        }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        return false;
      }
    } else {
      return false;
    }
  }
}